

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPlugin.cpp
# Opt level: O2

void __thiscall
DISTRHO::Plugin::initAudioPort(Plugin *this,bool input,uint32_t index,AudioPort *port)

{
  char *strBuf;
  char *pcVar1;
  char *strBuf_00;
  String local_40;
  
  if ((port->hints & 1) == 0) {
    strBuf = "Audio Output ";
    if (input) {
      strBuf = "Audio Input ";
    }
    pcVar1 = "audio_in_";
    strBuf_00 = "audio_out_";
  }
  else {
    strBuf = "CV Output ";
    if (input) {
      strBuf = "CV Input ";
    }
    pcVar1 = "cv_in_";
    strBuf_00 = "cv_out_";
  }
  if (input) {
    strBuf_00 = pcVar1;
  }
  String::operator=(&port->name,strBuf);
  String::String(&local_40,index + 1,false);
  String::operator+=(&port->name,local_40.fBuffer);
  String::~String(&local_40);
  String::operator=(&port->symbol,strBuf_00);
  String::String(&local_40,index + 1,false);
  String::operator+=(&port->symbol,local_40.fBuffer);
  String::~String(&local_40);
  return;
}

Assistant:

void Plugin::initAudioPort(bool input, uint32_t index, AudioPort& port)
{
    if (port.hints & kAudioPortIsCV)
    {
        port.name    = input ? "CV Input " : "CV Output ";
        port.name   += String(index+1);
        port.symbol  = input ? "cv_in_" : "cv_out_";
        port.symbol += String(index+1);
    }
    else
    {
        port.name    = input ? "Audio Input " : "Audio Output ";
        port.name   += String(index+1);
        port.symbol  = input ? "audio_in_" : "audio_out_";
        port.symbol += String(index+1);
    }
}